

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  uint *puVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  float *ptr;
  int iVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  int iVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [28];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  
  auVar8 = _DAT_005981a0;
  auVar7 = _DAT_00598180;
  auVar32 = in_ZMM5._0_16_;
  iVar22 = bottom_top_blob->elempack;
  iVar19 = bottom_top_blob->dims;
  iVar25 = bottom_top_blob->w;
  uVar29 = bottom_top_blob->h;
  uVar21 = bottom_top_blob->c;
  if (iVar19 == 3) {
    if (0 < (int)uVar21) {
      uVar29 = iVar25 * iVar22 * uVar29;
      pp_Var4 = this->_vptr_PReLU_x86_avx;
      uVar23 = 0;
      auVar46 = ZEXT816(0) << 0x40;
      auVar35._8_8_ = 0x8000000000000000;
      auVar35._0_8_ = 0x8000000000000000;
      auVar32 = vpcmpeqd_avx(auVar32,auVar32);
      auVar38._8_4_ = 0xffff;
      auVar38._0_8_ = 0xffff0000ffff;
      auVar38._12_4_ = 0xffff;
      auVar38._16_4_ = 0xffff;
      auVar38._20_4_ = 0xffff;
      auVar38._24_4_ = 0xffff;
      auVar38._28_4_ = 0xffff;
      do {
        p_Var5 = pp_Var4[-3];
        iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var5);
        uVar18 = 0;
        if (1 < iVar19) {
          uVar18 = uVar23;
        }
        uVar3 = *(uint *)(*(long *)(&this->field_0xd8 + (long)p_Var5) + uVar18 * 4);
        if (iVar19 < 2 || iVar22 != 4) {
          auVar34 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
        }
        else {
          auVar34 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0xd8 + (long)p_Var5) + uVar23 * 0x10);
        }
        if (iVar22 == 8 && 1 < iVar19) {
          auVar42 = SUB3228(*(undefined1 (*) [32])
                             (*(long *)(&this->field_0xd8 + (long)p_Var5) + uVar23 * 0x20),0);
        }
        else {
          auVar45._16_16_ = auVar34;
          auVar45._0_16_ = auVar34;
          auVar42 = auVar45._0_28_;
        }
        pauVar31 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar23 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar26 = 0;
        if (7 < (int)uVar29) {
          iVar19 = 7;
          do {
            auVar43 = vmaxps_avx(*pauVar31,ZEXT1632(auVar46));
            auVar9 = vminps_avx(*pauVar31,ZEXT1632(auVar46));
            auVar50._0_4_ = auVar9._0_4_ * auVar42._0_4_ + auVar43._0_4_;
            auVar50._4_4_ = auVar9._4_4_ * auVar42._4_4_ + auVar43._4_4_;
            auVar50._8_4_ = auVar9._8_4_ * auVar42._8_4_ + auVar43._8_4_;
            auVar50._12_4_ = auVar9._12_4_ * auVar42._12_4_ + auVar43._12_4_;
            auVar50._16_4_ = auVar9._16_4_ * auVar42._16_4_ + auVar43._16_4_;
            auVar50._20_4_ = auVar9._20_4_ * auVar42._20_4_ + auVar43._20_4_;
            auVar50._24_4_ = auVar9._24_4_ * auVar42._24_4_ + auVar43._24_4_;
            auVar50._28_4_ = auVar9._28_4_ + auVar43._28_4_;
            *pauVar31 = auVar50;
            pauVar31 = pauVar31 + 1;
            iVar19 = iVar19 + 8;
            uVar26 = uVar29 & 0xfffffff8;
          } while (iVar19 < (int)uVar29);
        }
        uVar20 = uVar26 | 3;
        while ((int)uVar20 < (int)uVar29) {
          auVar33 = vmaxps_avx(*(undefined1 (*) [16])*pauVar31,ZEXT816(0) << 0x40);
          auVar36 = vminps_avx(*(undefined1 (*) [16])*pauVar31,ZEXT816(0) << 0x40);
          *(float *)*pauVar31 = auVar36._0_4_ * auVar34._0_4_ + auVar33._0_4_;
          *(float *)(*pauVar31 + 4) = auVar36._4_4_ * auVar34._4_4_ + auVar33._4_4_;
          *(float *)(*pauVar31 + 8) = auVar36._8_4_ * auVar34._8_4_ + auVar33._8_4_;
          *(float *)(*pauVar31 + 0xc) = auVar36._12_4_ * auVar34._12_4_ + auVar33._12_4_;
          pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
          uVar20 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar29) {
          uVar18 = CONCAT44(0,~uVar26 + uVar29);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar18;
          auVar36 = vpshufd_avx(auVar41,0x44);
          auVar39 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
          auVar34 = vorps_avx(auVar36,auVar35);
          auVar33 = vorps_avx(auVar36,auVar35);
          uVar28 = 0;
          do {
            auVar54._8_8_ = 0;
            auVar54._0_8_ = uVar28;
            auVar56 = vpshufd_avx(auVar54,0x44);
            auVar60._16_16_ = auVar56;
            auVar60._0_16_ = auVar56;
            auVar43 = vorps_avx(auVar60,auVar7);
            auVar9 = vorps_avx(auVar60,auVar8);
            auVar56 = vorps_avx(auVar36,auVar35);
            auVar71._0_8_ = auVar9._16_8_ ^ 0x8000000000000000;
            auVar71._8_4_ = auVar9._24_4_;
            auVar71._12_4_ = auVar9._28_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar71,auVar56);
            auVar55._0_8_ = auVar9._0_8_ ^ 0x8000000000000000;
            auVar55._8_4_ = auVar9._8_4_;
            auVar55._12_4_ = auVar9._12_4_ ^ 0x80000000;
            auVar68 = vpcmpgtq_avx(auVar55,auVar34);
            auVar53 = vpackssdw_avx(auVar68,auVar53);
            auVar72._0_8_ = auVar43._16_8_ ^ 0x8000000000000000;
            auVar72._8_4_ = auVar43._24_4_;
            auVar72._12_4_ = auVar43._28_4_ ^ 0x80000000;
            auVar56 = vpcmpgtq_avx(auVar72,auVar56);
            auVar65._0_8_ = auVar43._0_8_ ^ 0x8000000000000000;
            auVar65._8_4_ = auVar43._8_4_;
            auVar65._12_4_ = auVar43._12_4_ ^ 0x80000000;
            auVar68 = vpcmpgtq_avx(auVar65,auVar33);
            auVar56 = vpackssdw_avx(auVar68,auVar56);
            auVar56 = vpackssdw_avx(auVar56 ^ auVar32,auVar53 ^ auVar32);
            auVar53 = vpmovsxwd_avx(auVar56);
            auVar68 = vpunpckhwd_avx(auVar56,auVar56);
            auVar67._16_16_ = auVar68;
            auVar67._0_16_ = auVar53;
            auVar9 = vmaskmovps_avx(auVar67,*(undefined1 (*) [32])(*pauVar31 + uVar28 * 4));
            auVar43 = vcmpps_avx(auVar9,ZEXT1632(auVar46),1);
            auVar43 = vandps_avx(auVar43,auVar38);
            auVar53 = vpackusdw_avx(auVar43._0_16_,auVar43._16_16_);
            auVar56 = vpand_avx(auVar56,auVar53);
            auVar53 = vpmovzxwd_avx(auVar56);
            auVar53 = vpslld_avx(auVar53,0x1f);
            auVar56 = vpunpckhwd_avx(auVar56,auVar56);
            auVar56 = vpslld_avx(auVar56,0x1f);
            auVar61._16_16_ = auVar56;
            auVar61._0_16_ = auVar53;
            auVar11._4_4_ = auVar9._4_4_ * auVar39._4_4_;
            auVar11._0_4_ = auVar9._0_4_ * auVar39._0_4_;
            auVar11._8_4_ = auVar9._8_4_ * auVar39._8_4_;
            auVar11._12_4_ = auVar9._12_4_ * auVar39._12_4_;
            auVar11._16_4_ = auVar9._16_4_ * auVar39._0_4_;
            auVar11._20_4_ = auVar9._20_4_ * auVar39._4_4_;
            auVar11._24_4_ = auVar9._24_4_ * auVar39._8_4_;
            auVar11._28_4_ = auVar9._28_4_;
            auVar43 = vmaskmovps_avx(auVar61,auVar11);
            *(undefined1 (*) [32])(*pauVar31 + uVar28 * 4) = auVar43;
            uVar28 = uVar28 + 8;
          } while ((uVar18 + 8 & 0x1fffffff8) != uVar28);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar21);
    }
  }
  else if (iVar19 == 2) {
    if (0 < (int)uVar29) {
      uVar21 = iVar22 * iVar25;
      pp_Var4 = this->_vptr_PReLU_x86_avx;
      uVar23 = 0;
      auVar46 = ZEXT816(0) << 0x40;
      auVar34._8_8_ = 0x8000000000000000;
      auVar34._0_8_ = 0x8000000000000000;
      auVar32 = vpcmpeqd_avx(auVar32,auVar32);
      auVar37._8_4_ = 0xffff;
      auVar37._0_8_ = 0xffff0000ffff;
      auVar37._12_4_ = 0xffff;
      auVar37._16_4_ = 0xffff;
      auVar37._20_4_ = 0xffff;
      auVar37._24_4_ = 0xffff;
      auVar37._28_4_ = 0xffff;
      do {
        p_Var5 = pp_Var4[-3];
        iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var5);
        uVar18 = 0;
        if (1 < iVar19) {
          uVar18 = uVar23;
        }
        uVar3 = *(uint *)(*(long *)(&this->field_0xd8 + (long)p_Var5) + uVar18 * 4);
        if (iVar19 < 2 || iVar22 != 4) {
          auVar33 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
        }
        else {
          auVar33 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0xd8 + (long)p_Var5) + uVar23 * 0x10);
        }
        if (iVar22 == 8 && 1 < iVar19) {
          auVar42 = SUB3228(*(undefined1 (*) [32])
                             (*(long *)(&this->field_0xd8 + (long)p_Var5) + uVar23 * 0x20),0);
        }
        else {
          auVar44._16_16_ = auVar33;
          auVar44._0_16_ = auVar33;
          auVar42 = auVar44._0_28_;
        }
        pauVar31 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar23 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar26 = 0;
        if (7 < (int)uVar21) {
          iVar19 = 7;
          do {
            auVar43 = vmaxps_avx(*pauVar31,ZEXT1632(auVar46));
            auVar9 = vminps_avx(*pauVar31,ZEXT1632(auVar46));
            auVar49._0_4_ = auVar9._0_4_ * auVar42._0_4_ + auVar43._0_4_;
            auVar49._4_4_ = auVar9._4_4_ * auVar42._4_4_ + auVar43._4_4_;
            auVar49._8_4_ = auVar9._8_4_ * auVar42._8_4_ + auVar43._8_4_;
            auVar49._12_4_ = auVar9._12_4_ * auVar42._12_4_ + auVar43._12_4_;
            auVar49._16_4_ = auVar9._16_4_ * auVar42._16_4_ + auVar43._16_4_;
            auVar49._20_4_ = auVar9._20_4_ * auVar42._20_4_ + auVar43._20_4_;
            auVar49._24_4_ = auVar9._24_4_ * auVar42._24_4_ + auVar43._24_4_;
            auVar49._28_4_ = auVar9._28_4_ + auVar43._28_4_;
            *pauVar31 = auVar49;
            pauVar31 = pauVar31 + 1;
            iVar19 = iVar19 + 8;
            uVar26 = uVar21 & 0xfffffff8;
          } while (iVar19 < (int)uVar21);
        }
        uVar20 = uVar26 | 3;
        while ((int)uVar20 < (int)uVar21) {
          auVar36 = vmaxps_avx(*(undefined1 (*) [16])*pauVar31,ZEXT816(0) << 0x40);
          auVar39 = vminps_avx(*(undefined1 (*) [16])*pauVar31,ZEXT816(0) << 0x40);
          *(float *)*pauVar31 = auVar39._0_4_ * auVar33._0_4_ + auVar36._0_4_;
          *(float *)(*pauVar31 + 4) = auVar39._4_4_ * auVar33._4_4_ + auVar36._4_4_;
          *(float *)(*pauVar31 + 8) = auVar39._8_4_ * auVar33._8_4_ + auVar36._8_4_;
          *(float *)(*pauVar31 + 0xc) = auVar39._12_4_ * auVar33._12_4_ + auVar36._12_4_;
          pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
          uVar20 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar21) {
          uVar18 = CONCAT44(0,~uVar26 + uVar21);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar18;
          auVar39 = vpshufd_avx(auVar40,0x44);
          auVar56 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
          auVar33 = vorps_avx(auVar39,auVar34);
          auVar36 = vorps_avx(auVar39,auVar34);
          uVar28 = 0;
          do {
            auVar51._8_8_ = 0;
            auVar51._0_8_ = uVar28;
            auVar53 = vpshufd_avx(auVar51,0x44);
            auVar58._16_16_ = auVar53;
            auVar58._0_16_ = auVar53;
            auVar43 = vorps_avx(auVar58,auVar7);
            auVar9 = vorps_avx(auVar58,auVar8);
            auVar53 = vorps_avx(auVar39,auVar34);
            auVar69._0_8_ = auVar9._16_8_ ^ 0x8000000000000000;
            auVar69._8_4_ = auVar9._24_4_;
            auVar69._12_4_ = auVar9._28_4_ ^ 0x80000000;
            auVar68 = vpcmpgtq_avx(auVar69,auVar53);
            auVar52._0_8_ = auVar9._0_8_ ^ 0x8000000000000000;
            auVar52._8_4_ = auVar9._8_4_;
            auVar52._12_4_ = auVar9._12_4_ ^ 0x80000000;
            auVar62 = vpcmpgtq_avx(auVar52,auVar33);
            auVar68 = vpackssdw_avx(auVar62,auVar68);
            auVar70._0_8_ = auVar43._16_8_ ^ 0x8000000000000000;
            auVar70._8_4_ = auVar43._24_4_;
            auVar70._12_4_ = auVar43._28_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar70,auVar53);
            auVar64._0_8_ = auVar43._0_8_ ^ 0x8000000000000000;
            auVar64._8_4_ = auVar43._8_4_;
            auVar64._12_4_ = auVar43._12_4_ ^ 0x80000000;
            auVar62 = vpcmpgtq_avx(auVar64,auVar36);
            auVar53 = vpackssdw_avx(auVar62,auVar53);
            auVar53 = vpackssdw_avx(auVar53 ^ auVar32,auVar68 ^ auVar32);
            auVar68 = vpmovsxwd_avx(auVar53);
            auVar62 = vpunpckhwd_avx(auVar53,auVar53);
            auVar66._16_16_ = auVar62;
            auVar66._0_16_ = auVar68;
            auVar9 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])(*pauVar31 + uVar28 * 4));
            auVar43 = vcmpps_avx(auVar9,ZEXT1632(auVar46),1);
            auVar43 = vandps_avx(auVar43,auVar37);
            auVar68 = vpackusdw_avx(auVar43._0_16_,auVar43._16_16_);
            auVar53 = vpand_avx(auVar53,auVar68);
            auVar68 = vpmovzxwd_avx(auVar53);
            auVar68 = vpslld_avx(auVar68,0x1f);
            auVar53 = vpunpckhwd_avx(auVar53,auVar53);
            auVar53 = vpslld_avx(auVar53,0x1f);
            auVar59._16_16_ = auVar53;
            auVar59._0_16_ = auVar68;
            auVar10._4_4_ = auVar9._4_4_ * auVar56._4_4_;
            auVar10._0_4_ = auVar9._0_4_ * auVar56._0_4_;
            auVar10._8_4_ = auVar9._8_4_ * auVar56._8_4_;
            auVar10._12_4_ = auVar9._12_4_ * auVar56._12_4_;
            auVar10._16_4_ = auVar9._16_4_ * auVar56._0_4_;
            auVar10._20_4_ = auVar9._20_4_ * auVar56._4_4_;
            auVar10._24_4_ = auVar9._24_4_ * auVar56._8_4_;
            auVar10._28_4_ = auVar9._28_4_;
            auVar43 = vmaskmovps_avx(auVar59,auVar10);
            *(undefined1 (*) [32])(*pauVar31 + uVar28 * 4) = auVar43;
            uVar28 = uVar28 + 8;
          } while ((uVar18 + 8 & 0x1fffffff8) != uVar28);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar29);
    }
  }
  else if (iVar19 == 1) {
    iVar22 = iVar22 * iVar25;
    pp_Var4 = this->_vptr_PReLU_x86_avx;
    p_Var5 = pp_Var4[-3];
    pauVar31 = (undefined1 (*) [32])bottom_top_blob->data;
    puVar6 = *(uint **)(&this->field_0xd8 + (long)p_Var5);
    if (*(int *)(&this->field_0xd0 + (long)p_Var5) < 2) {
      uVar29 = *puVar6;
      iVar19 = iVar22 + 7;
      if (-1 < iVar22) {
        iVar19 = iVar22;
      }
      uVar21 = iVar19 >> 3;
      if (7 < iVar22) {
        auVar32 = vshufps_avx(ZEXT416(uVar29),ZEXT416(uVar29),0);
        uVar23 = (ulong)uVar21;
        pauVar30 = pauVar31;
        do {
          auVar7 = vmaxps_avx(*pauVar30,ZEXT1632(ZEXT816(0) << 0x40));
          auVar8 = vminps_avx(*pauVar30,ZEXT1632(ZEXT816(0) << 0x40));
          *(float *)*pauVar30 = auVar8._0_4_ * auVar32._0_4_ + auVar7._0_4_;
          *(float *)(*pauVar30 + 4) = auVar8._4_4_ * auVar32._4_4_ + auVar7._4_4_;
          *(float *)(*pauVar30 + 8) = auVar8._8_4_ * auVar32._8_4_ + auVar7._8_4_;
          *(float *)(*pauVar30 + 0xc) = auVar8._12_4_ * auVar32._12_4_ + auVar7._12_4_;
          *(float *)(*pauVar30 + 0x10) = auVar8._16_4_ * auVar32._0_4_ + auVar7._16_4_;
          *(float *)(*pauVar30 + 0x14) = auVar8._20_4_ * auVar32._4_4_ + auVar7._20_4_;
          *(float *)(*pauVar30 + 0x18) = auVar8._24_4_ * auVar32._8_4_ + auVar7._24_4_;
          *(float *)(*pauVar30 + 0x1c) = auVar8._28_4_ + auVar7._28_4_;
          pauVar30 = pauVar30 + 1;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      iVar25 = iVar22 + uVar21 * -8;
      iVar19 = iVar25 + 3;
      if (-1 < iVar25) {
        iVar19 = iVar25;
      }
      auVar32 = ZEXT416(uVar29);
      if (3 < iVar25) {
        auVar46 = vshufps_avx(auVar32,auVar32,0);
        uVar23 = (ulong)(uint)(iVar19 >> 2);
        pauVar24 = (undefined1 (*) [16])(*pauVar31 + (long)(int)(uVar21 * 8) * 4);
        do {
          auVar34 = vmaxps_avx(*pauVar24,ZEXT816(0) << 0x40);
          auVar33 = vminps_avx(*pauVar24,ZEXT816(0) << 0x40);
          *(float *)*pauVar24 = auVar33._0_4_ * auVar46._0_4_ + auVar34._0_4_;
          *(float *)(*pauVar24 + 4) = auVar33._4_4_ * auVar46._4_4_ + auVar34._4_4_;
          *(float *)(*pauVar24 + 8) = auVar33._8_4_ * auVar46._8_4_ + auVar34._8_4_;
          *(float *)(*pauVar24 + 0xc) = auVar33._12_4_ * auVar46._12_4_ + auVar34._12_4_;
          pauVar24 = pauVar24 + 1;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      auVar8 = _DAT_005981a0;
      auVar7 = _DAT_00598180;
      iVar19 = uVar21 * 8 + (iVar19 >> 2) * 4;
      if (iVar19 < iVar22) {
        lVar27 = (long)iVar19;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (iVar22 - lVar27) - 1;
        auVar46 = vpshufd_avx(auVar46,0x44);
        auVar34 = vshufps_avx(auVar32,auVar32,0);
        uVar18 = 0;
        uVar23 = auVar46._0_8_;
        auVar33._0_8_ = uVar23 ^ 0x8000000000000000;
        auVar33._8_4_ = auVar46._8_4_;
        uVar29 = auVar46._12_4_;
        auVar33._12_4_ = uVar29 ^ 0x80000000;
        auVar36._0_8_ = uVar23 ^ 0x8000000000000000;
        auVar36._8_4_ = auVar33._8_4_;
        auVar36._12_4_ = uVar29 ^ 0x80000000;
        auVar32 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        auVar39._0_8_ = uVar23 ^ 0x8000000000000000;
        auVar39._8_4_ = auVar33._8_4_;
        auVar39._12_4_ = uVar29 ^ 0x80000000;
        auVar43._8_4_ = 0xffff;
        auVar43._0_8_ = 0xffff0000ffff;
        auVar43._12_4_ = 0xffff;
        auVar43._16_4_ = 0xffff;
        auVar43._20_4_ = 0xffff;
        auVar43._24_4_ = 0xffff;
        auVar43._28_4_ = 0xffff;
        do {
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uVar18;
          auVar46 = vpshufd_avx(auVar56,0x44);
          auVar47._16_16_ = auVar46;
          auVar47._0_16_ = auVar46;
          auVar9 = vorps_avx(auVar47,auVar7);
          auVar47 = vorps_avx(auVar47,auVar8);
          auVar62._0_8_ = auVar47._16_8_ ^ 0x8000000000000000;
          auVar62._8_4_ = auVar47._24_4_;
          auVar62._12_4_ = auVar47._28_4_ ^ 0x80000000;
          auVar46 = vpcmpgtq_avx(auVar62,auVar33);
          auVar53._0_8_ = auVar47._0_8_ ^ 0x8000000000000000;
          auVar53._8_4_ = auVar47._8_4_;
          auVar53._12_4_ = auVar47._12_4_ ^ 0x80000000;
          auVar56 = vpcmpgtq_avx(auVar53,auVar36);
          auVar46 = vpackssdw_avx(auVar56,auVar46);
          auVar63._0_8_ = auVar9._16_8_ ^ 0x8000000000000000;
          auVar63._8_4_ = auVar9._24_4_;
          auVar63._12_4_ = auVar9._28_4_ ^ 0x80000000;
          auVar56 = vpcmpgtq_avx(auVar63,auVar33);
          auVar68._0_8_ = auVar9._0_8_ ^ 0x8000000000000000;
          auVar68._8_4_ = auVar9._8_4_;
          auVar68._12_4_ = auVar9._12_4_ ^ 0x80000000;
          auVar53 = vpcmpgtq_avx(auVar68,auVar39);
          auVar56 = vpackssdw_avx(auVar53,auVar56);
          auVar46 = vpackssdw_avx(auVar56 ^ auVar32,auVar46 ^ auVar32);
          auVar56 = vpmovsxwd_avx(auVar46);
          auVar53 = vpunpckhwd_avx(auVar46,auVar46);
          auVar57._16_16_ = auVar53;
          auVar57._0_16_ = auVar56;
          auVar47 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                            (*pauVar31 + uVar18 * 4 + lVar27 * 4));
          auVar9 = vcmpps_avx(auVar47,ZEXT1632(ZEXT816(0) << 0x40),1);
          auVar9 = vandps_avx(auVar9,auVar43);
          auVar56 = vpackusdw_avx(auVar9._0_16_,auVar9._16_16_);
          auVar46 = vpand_avx(auVar46,auVar56);
          auVar56 = vpmovzxwd_avx(auVar46);
          auVar56 = vpslld_avx(auVar56,0x1f);
          auVar46 = vpunpckhwd_avx(auVar46,auVar46);
          auVar46 = vpslld_avx(auVar46,0x1f);
          auVar48._16_16_ = auVar46;
          auVar48._0_16_ = auVar56;
          auVar9._4_4_ = auVar47._4_4_ * auVar34._4_4_;
          auVar9._0_4_ = auVar47._0_4_ * auVar34._0_4_;
          auVar9._8_4_ = auVar47._8_4_ * auVar34._8_4_;
          auVar9._12_4_ = auVar47._12_4_ * auVar34._12_4_;
          auVar9._16_4_ = auVar47._16_4_ * auVar34._0_4_;
          auVar9._20_4_ = auVar47._20_4_ * auVar34._4_4_;
          auVar9._24_4_ = auVar47._24_4_ * auVar34._8_4_;
          auVar9._28_4_ = auVar47._28_4_;
          auVar9 = vmaskmovps_avx(auVar48,auVar9);
          *(undefined1 (*) [32])(*pauVar31 + uVar18 * 4 + lVar27 * 4) = auVar9;
          uVar18 = uVar18 + 8;
        } while (((iVar22 - lVar27) + 7U & 0xfffffffffffffff8) != uVar18);
      }
    }
    else {
      iVar19 = iVar22 + 7;
      if (-1 < iVar22) {
        iVar19 = iVar22;
      }
      uVar29 = iVar19 >> 3;
      if (7 < iVar22) {
        uVar23 = (ulong)uVar29;
        lVar27 = 0;
        do {
          auVar7 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar31 + lVar27),
                              ZEXT1632(ZEXT816(0) << 0x40));
          auVar8 = vminps_avx(*(undefined1 (*) [32])(*pauVar31 + lVar27),
                              ZEXT1632(ZEXT816(0) << 0x40));
          pfVar1 = (float *)((long)puVar6 + lVar27);
          fVar12 = pfVar1[1];
          fVar13 = pfVar1[2];
          fVar14 = pfVar1[3];
          fVar15 = pfVar1[4];
          fVar16 = pfVar1[5];
          fVar17 = pfVar1[6];
          pfVar2 = (float *)(*pauVar31 + lVar27);
          *pfVar2 = auVar8._0_4_ * *pfVar1 + auVar7._0_4_;
          pfVar2[1] = auVar8._4_4_ * fVar12 + auVar7._4_4_;
          pfVar2[2] = auVar8._8_4_ * fVar13 + auVar7._8_4_;
          pfVar2[3] = auVar8._12_4_ * fVar14 + auVar7._12_4_;
          pfVar2[4] = auVar8._16_4_ * fVar15 + auVar7._16_4_;
          pfVar2[5] = auVar8._20_4_ * fVar16 + auVar7._20_4_;
          pfVar2[6] = auVar8._24_4_ * fVar17 + auVar7._24_4_;
          pfVar2[7] = auVar8._28_4_ + auVar7._28_4_;
          lVar27 = lVar27 + 0x20;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      iVar25 = iVar22 + uVar29 * -8;
      iVar19 = iVar25 + 3;
      if (-1 < iVar25) {
        iVar19 = iVar25;
      }
      uVar23 = (ulong)(uint)(iVar19 >> 2);
      if (3 < iVar25) {
        lVar27 = (long)(int)(uVar29 * 8) << 2;
        do {
          auVar32 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar31 + lVar27),ZEXT816(0) << 0x40);
          auVar46 = vminps_avx(*(undefined1 (*) [16])(*pauVar31 + lVar27),ZEXT816(0) << 0x40);
          pfVar1 = (float *)((long)puVar6 + lVar27);
          fVar12 = pfVar1[1];
          fVar13 = pfVar1[2];
          fVar14 = pfVar1[3];
          pfVar2 = (float *)(*pauVar31 + lVar27);
          *pfVar2 = auVar46._0_4_ * *pfVar1 + auVar32._0_4_;
          pfVar2[1] = auVar46._4_4_ * fVar12 + auVar32._4_4_;
          pfVar2[2] = auVar46._8_4_ * fVar13 + auVar32._8_4_;
          pfVar2[3] = auVar46._12_4_ * fVar14 + auVar32._12_4_;
          lVar27 = lVar27 + 0x10;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      iVar19 = uVar29 * 8 + (iVar19 >> 2) * 4;
      if (iVar19 < iVar22) {
        lVar27 = (long)iVar19;
        do {
          if (*(float *)(*pauVar31 + lVar27 * 4) < 0.0) {
            *(float *)(*pauVar31 + lVar27 * 4) =
                 *(float *)(*pauVar31 + lVar27 * 4) *
                 *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var4[-3]) + lVar27 * 4);
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < iVar22);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}